

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  long *plVar1;
  uint64 uVar2;
  ulong uVar3;
  uint64 uVar4;
  uint64 uVar5;
  long *s_00;
  ulong uVar6;
  char *s_01;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  uint64 uVar11;
  long lVar12;
  pair<unsigned_long,_unsigned_long> pVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  uint128 uVar15;
  uint64 local_58;
  uint64 local_50;
  long local_48;
  uint64 local_38;
  
  uVar6 = seed.second;
  local_58 = seed.first;
  if (len < 0x80) {
    if (len < 0x11) {
      uVar10 = (local_58 * -0x4b6d499041670d8d >> 0x2f ^ local_58 * -0x4b6d499041670d8d) *
               -0x4b6d499041670d8d;
      uVar2 = HashLen0to16(s,len);
      uVar2 = uVar2 + uVar6 * -0x4b6d499041670d8d;
      uVar11 = uVar2;
      if (7 < len) {
        uVar11 = *(uint64 *)s;
      }
      uVar11 = uVar11 + uVar10 >> 0x2f ^ uVar11 + uVar10;
    }
    else {
      uVar2 = HashLen16(*(long *)(s + (len - 8)) + 0xb492b66fbe98f273,local_58);
      uVar11 = HashLen16(uVar6 + len,uVar2 + *(long *)(s + (len - 0x10)));
      uVar10 = uVar11 + local_58;
      uVar7 = len + 0x10;
      do {
        uVar10 = (((ulong)(*(long *)s * -0x4b6d499041670d8d) >> 0x2f ^
                  *(long *)s * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar10) *
                 -0x4b6d499041670d8d;
        uVar6 = uVar6 ^ uVar10;
        uVar2 = (((ulong)(*(long *)((long)s + 8) * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)((long)s + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar2) *
                -0x4b6d499041670d8d;
        uVar11 = uVar11 ^ uVar2;
        s = (char *)((long)s + 0x10);
        uVar7 = uVar7 - 0x10;
      } while (0x20 < uVar7);
    }
    uVar4 = HashLen16(uVar10,uVar2);
    uVar5 = HashLen16(uVar11,uVar6);
    uVar6 = uVar5 ^ uVar4;
  }
  else {
    uVar10 = ((uVar6 ^ 0xb492b66fbe98f273) << 0xf | (uVar6 ^ 0xb492b66fbe98f273) >> 0x31) *
             -0x4b6d499041670d8d + *(long *)s;
    uVar7 = len * -0x4b6d499041670d8d;
    pVar13.second = (uVar10 * 0x400000 | uVar10 >> 0x2a) * -0x4b6d499041670d8d + *(long *)(s + 8);
    pVar13.first = uVar10;
    pVar14.second =
         ((*(long *)(s + 0x58) + local_58) * 0x800 | *(long *)(s + 0x58) + local_58 >> 0x35) *
         -0x4b6d499041670d8d;
    pVar14.first = ((uVar7 + uVar6) * 0x20000000 | uVar7 + uVar6 >> 0x23) * -0x4b6d499041670d8d +
                   local_58;
    s_01 = s + 0x40;
    sVar8 = len;
    do {
      uVar10 = local_58 + pVar13.first + uVar6 + *(long *)(s_01 + -0x38);
      uVar6 = uVar6 + pVar13.second + *(long *)(s_01 + -0x10);
      uVar10 = (uVar10 * 0x8000000 | uVar10 >> 0x25) * -0x4b6d499041670d8d ^ pVar14.second;
      uVar7 = uVar7 + pVar14.first;
      lVar9 = pVar13.first + *(long *)(s_01 + -0x18) +
              (uVar6 * 0x400000 | uVar6 >> 0x2a) * -0x4b6d499041670d8d;
      lVar12 = (uVar7 * 0x80000000 | uVar7 >> 0x21) * -0x4b6d499041670d8d;
      pVar13 = WeakHashLen32WithSeeds
                         (s_01 + -0x40,pVar13.second * -0x4b6d499041670d8d,pVar14.first + uVar10);
      pVar14 = WeakHashLen32WithSeeds
                         (s_01 + -0x20,pVar14.second + lVar12,*(long *)(s_01 + -0x30) + lVar9);
      uVar7 = lVar12 + lVar9 + pVar13.first + *(long *)(s_01 + 8);
      uVar6 = lVar9 + pVar13.second + *(long *)(s_01 + 0x30);
      uVar7 = (uVar7 * 0x8000000 | uVar7 >> 0x25) * -0x4b6d499041670d8d ^ pVar14.second;
      uVar10 = uVar10 + pVar14.first;
      uVar6 = pVar13.first + *(long *)(s_01 + 0x28) +
              (uVar6 * 0x400000 | uVar6 >> 0x2a) * -0x4b6d499041670d8d;
      local_58 = (uVar10 * 0x80000000 | uVar10 >> 0x21) * -0x4b6d499041670d8d;
      pVar13 = WeakHashLen32WithSeeds(s_01,pVar13.second * -0x4b6d499041670d8d,pVar14.first + uVar7)
      ;
      pVar14 = WeakHashLen32WithSeeds
                         (s_01 + 0x20,pVar14.second + local_58,*(long *)(s_01 + 0x10) + uVar6);
      local_38 = pVar14.second;
      uVar10 = pVar14.first;
      sVar8 = sVar8 - 0x80;
      s_01 = s_01 + 0x80;
    } while (0x7f < sVar8);
    uVar3 = pVar13.first + uVar7;
    local_58 = (uVar3 * 0x8000 | uVar3 >> 0x31) * -0x3c5a37a36834ced9 + local_58;
    lVar9 = (local_38 << 0x1b | local_38 >> 0x25) + uVar6 * -0x3c5a37a36834ced9;
    local_50 = uVar10 * 9;
    local_48 = (uVar10 << 0x25 | uVar10 >> 0x1b) + uVar7 * -0x3c5a37a36834ced9;
    uVar6 = 0;
    plVar1 = (long *)(s + len);
    while( true ) {
      uVar2 = pVar13.second;
      s_00 = plVar1 + -4;
      uVar11 = pVar13.first * -0x3c5a37a36834ced9;
      if (sVar8 <= uVar6) break;
      uVar6 = uVar6 + 0x20;
      local_50 = local_50 + plVar1[-2];
      lVar9 = ((lVar9 + local_58) * 0x400000 | lVar9 + local_58 >> 0x2a) * -0x3c5a37a36834ced9 +
              uVar2;
      local_58 = local_58 * -0x3c5a37a36834ced9 + local_50;
      local_48 = local_48 + local_38 + *s_00;
      local_38 = local_38 + uVar11;
      pVar13 = WeakHashLen32WithSeeds((char *)s_00,uVar11 + local_48,uVar2);
      plVar1 = s_00;
    }
    uVar5 = HashLen16(local_58,uVar11);
    uVar4 = HashLen16(lVar9 + local_48,local_50);
    uVar11 = HashLen16(uVar5 + uVar2,local_38);
    uVar6 = uVar11 + uVar4;
    uVar5 = uVar5 + local_38;
    uVar4 = uVar4 + uVar2;
  }
  uVar2 = HashLen16(uVar5,uVar4);
  uVar15.second = uVar2;
  uVar15.first = uVar6;
  return uVar15;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}